

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O1

int cpu_exec_ppc64(uc_struct_conflict11 *uc,CPUState *cpu)

{
  TranslationBlock **ppTVar1;
  uint32_t flags;
  uc_struct_conflict7 *puVar2;
  void *pvVar3;
  CPUWatchpoint *pCVar4;
  CPUClass *pCVar5;
  long lVar6;
  void *pvVar7;
  _func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *p_Var8;
  _func_void_CPUState_ptr_vaddr_conflict *p_Var9;
  vaddr vVar10;
  _Bool _Var11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  TranslationBlock *pTVar18;
  TranslationBlock *pTVar19;
  TranslationBlock *pTVar20;
  uint uVar21;
  uint32_t cflags;
  CPUClass *pCVar22;
  list_item *plVar23;
  uc_struct_conflict11 *puVar24;
  TranslationBlock_conflict *pTVar25;
  bool bVar26;
  uc_tb cur_tb;
  TranslationBlock *local_68;
  target_ulong local_50;
  uint16_t local_48;
  uint16_t local_46;
  target_ulong local_40;
  uint16_t local_38;
  uint16_t local_36;
  
  pCVar22 = cpu->cc;
  if (cpu->halted != 0) {
    if (pCVar22->has_work == (_func__Bool_CPUState_ptr_conflict *)0x0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                 ,0x1bc,"cc->has_work");
    }
    _Var11 = (*pCVar22->has_work)((CPUState_conflict *)cpu);
    if (!_Var11) {
      return 0x10003;
    }
    cpu->halted = 0;
  }
  (*pCVar22->cpu_exec_enter)((CPUState_conflict *)cpu);
  iVar13 = __sigsetjmp(uc->exits + (long)uc->nested_level * 0x19 + 0x33,0);
  puVar24 = uc;
  if (iVar13 != 0) {
    pCVar22 = cpu->cc;
  }
  do {
    uVar17 = (uint)puVar24;
    puVar2 = cpu->uc;
    if ((puVar2->stop_interrupt == (uc_args_int_t_conflict7)0x0) ||
       (_Var11 = (*puVar2->stop_interrupt)(puVar2,cpu->exception_index), !_Var11)) {
      uVar14 = cpu->exception_index;
      if ((int)uVar14 < 0) {
        bVar26 = false;
      }
      else if ((int)uVar14 < 0x10000) {
        ppTVar1 = puVar2->cpu[1].tb_jmp_cache + 0x3ae;
        *ppTVar1 = (TranslationBlock *)((long)&(*ppTVar1)->pc + 4);
        bVar26 = false;
        for (plVar23 = puVar2->hook[0].head;
            (plVar23 != (list_item *)0x0 && (pvVar3 = plVar23->data, pvVar3 != (void *)0x0));
            plVar23 = plVar23->next) {
          if (*(char *)((long)pvVar3 + 0x14) == '\0') {
            (**(code **)((long)pvVar3 + 0x28))
                      (puVar2,cpu->exception_index,*(undefined8 *)((long)pvVar3 + 0x30));
            bVar26 = true;
          }
        }
        if (bVar26) {
          cpu->exception_index = -1;
          uVar17 = 0x10000;
        }
        else {
          puVar2->invalid_error = 0x15;
          cpu->halted = 1;
          uVar17 = 0x10001;
        }
        bVar26 = (bool)(bVar26 ^ 1);
      }
      else {
        if (uVar14 == 0x10002) {
          pCVar5 = cpu->cc;
          if (cpu->watchpoint_hit == (CPUWatchpoint *)0x0) {
            for (pCVar4 = (cpu->watchpoints).tqh_first; pCVar4 != (CPUWatchpoint *)0x0;
                pCVar4 = (pCVar4->entry).tqe_next) {
              *(byte *)&pCVar4->flags = (byte)pCVar4->flags & 0x3f;
            }
          }
          (*pCVar5->debug_excp_handler)((CPUState_conflict *)cpu);
        }
        cpu->exception_index = -1;
        bVar26 = true;
        uVar17 = uVar14;
      }
    }
    else {
      plVar23 = puVar2->hook[0xe].head;
      if (plVar23 == (list_item *)0x0) {
LAB_00b57cda:
        puVar2->invalid_error = 10;
      }
      else {
        bVar12 = 0;
        while (pvVar3 = plVar23->data, pvVar3 != (void *)0x0) {
          if (((*(char *)((long)pvVar3 + 0x14) == '\0') &&
              (bVar12 = (**(code **)((long)pvVar3 + 0x28))
                                  (puVar2,*(undefined8 *)((long)pvVar3 + 0x30)), bVar12 != 0)) ||
             (plVar23 = plVar23->next, plVar23 == (list_item *)0x0)) break;
        }
        if ((bVar12 & 1) == 0) goto LAB_00b57cda;
      }
      bVar26 = true;
      uVar17 = 0x10001;
    }
    if (bVar26) {
      uc->cpu->tcg_exit_req = 0;
      (*pCVar22->cpu_exec_exit)((CPUState_conflict *)cpu);
      return uVar17;
    }
    pTVar19 = (TranslationBlock *)0x0;
    pTVar18 = pTVar19;
LAB_00b57dfc:
    pCVar5 = cpu->cc;
    *(undefined2 *)((long)cpu[1].tb_jmp_cache + 0x1aba) = 0;
    uVar14 = cpu->interrupt_request;
    if (uVar14 == 0) {
LAB_00b57e17:
      if (cpu->exit_request == true) {
        cpu->exit_request = false;
        bVar26 = true;
        if (cpu->exception_index == -1) {
          cpu->exception_index = 0x10000;
        }
      }
      else {
        bVar26 = false;
      }
    }
    else {
      uVar21 = uVar14;
      if ((cpu->singlestep_enabled & 2) != 0) {
        uVar21 = uVar14 & 0xffffeda5;
      }
      if ((char)uVar21 < '\0') {
        cpu->interrupt_request = uVar14 & 0xffffff7f;
        cpu->exception_index = 0x10002;
      }
      else {
        if ((uVar21 >> 10 & 1) == 0) {
          _Var11 = (*pCVar5->cpu_exec_interrupt)((CPUState_conflict *)cpu,uVar21);
          if (_Var11) {
            cpu->exception_index = -1;
            pTVar18 = (TranslationBlock *)0x0;
          }
          if ((cpu->interrupt_request & 4) != 0) {
            cpu->interrupt_request = cpu->interrupt_request & 0xfffffffb;
            pTVar18 = (TranslationBlock *)0x0;
          }
          goto LAB_00b57e17;
        }
        cpu_reset(cpu);
      }
      bVar26 = true;
    }
    if (!bVar26) {
      cflags = cpu->cflags_next_tb;
      if (cflags == 0xffffffff) {
        cflags = 0;
      }
      else {
        cpu->cflags_next_tb = 0xffffffff;
      }
      puVar2 = cpu->uc;
      uVar15 = *(ulong *)((long)cpu->env_ptr + 0x2a8);
      flags = *(uint32_t *)((long)cpu->env_ptr + 0x13318);
      uVar14 = (uint)(uVar15 >> 6) ^ (uint)uVar15;
      uVar14 = uVar14 & 0x3f | uVar14 >> 6 & 0xfc0;
      local_68 = cpu->tb_jmp_cache[uVar14];
      uVar21 = cpu->cluster_index << 0x18 | cflags & 0xffffff;
      if ((((local_68 == (TranslationBlock *)0x0) || (local_68->pc != uVar15)) ||
          ((local_68->cs_base != 0 ||
           ((local_68->flags != flags ||
            (cpu->trace_dstate[0] != (ulong)local_68->trace_vcpu_dstate)))))) ||
         ((local_68->cflags & 0xff0effff) != uVar21)) {
        local_68 = (TranslationBlock *)0x0;
        pTVar20 = tb_htable_lookup_ppc64(cpu,uVar15,0,flags,uVar21);
        if (pTVar20 != (TranslationBlock *)0x0) {
          cpu->tb_jmp_cache[uVar14] = pTVar20;
          local_68 = pTVar20;
        }
      }
      if (local_68 == (TranslationBlock *)0x0) {
        local_68 = tb_gen_code_ppc64(cpu,uVar15,0,flags,cflags);
        cpu->tb_jmp_cache[uVar14] = local_68;
        pTVar20 = puVar2->last_tb;
        if (pTVar20 != (TranslationBlock *)0x0) {
          local_40 = local_68->pc;
          local_38 = local_68->icount;
          local_36 = local_68->size;
          local_50 = pTVar20->pc;
          local_48 = pTVar20->icount;
          local_46 = pTVar20->size;
          for (plVar23 = puVar2->hook[0xf].head;
              (plVar23 != (list_item *)0x0 && (pvVar3 = plVar23->data, pvVar3 != (void *)0x0));
              plVar23 = plVar23->next) {
            if (*(char *)((long)pvVar3 + 0x14) == '\0') {
              if (((*(ulong *)((long)pvVar3 + 0x18) <= local_68->pc) &&
                  (local_68->pc <= *(ulong *)((long)pvVar3 + 0x20))) ||
                 (*(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18))) {
                (**(code **)((long)pvVar3 + 0x28))
                          (puVar2,&local_40,&local_50,*(undefined8 *)((long)pvVar3 + 0x30));
              }
            }
          }
        }
      }
      if ((pTVar18 != (TranslationBlock *)0x0) && (local_68->page_addr[1] == 0xffffffffffffffff)) {
        if (1 < (uint)pTVar19) {
          __assert_fail("n < ARRAY_SIZE(tb->jmp_list_next)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                        ,0xda,"void tb_add_jump(TranslationBlock *, int, TranslationBlock *)");
        }
        if ((local_68->cflags & 0x40000) == 0) {
          LOCK();
          bVar26 = pTVar18->jmp_dest[(long)pTVar19] == 0;
          if (bVar26) {
            pTVar18->jmp_dest[(long)pTVar19] = (uintptr_t)local_68;
          }
          UNLOCK();
          if (bVar26) {
            pvVar3 = (pTVar18->tc).ptr;
            *(int *)(pTVar18->jmp_target_arg[(long)pTVar19] + (long)pvVar3) =
                 (*(int *)&(local_68->tc).ptr -
                 ((int)pTVar18->jmp_target_arg[(long)pTVar19] + (int)pvVar3)) + -4;
            pTVar18->jmp_list_next[(long)pTVar19] = local_68->jmp_list_head;
            local_68->jmp_list_head = (ulong)pTVar18 | (ulong)pTVar19;
          }
        }
      }
      if (cpu->exit_request == false) {
        pvVar3 = cpu->env_ptr;
        tb_exec_lock_ppc64((TCGContext_conflict10 *)cpu->uc->tcg_ctx);
        uVar15 = (**(code **)(*(long *)(*(long *)((long)pvVar3 + 0x138a0) + 0x2e8) + 0x90))(pvVar3);
        if (cpu->uc->nested_level == 1) {
          tb_exec_unlock_ppc64((TCGContext_conflict10 *)cpu->uc->tcg_ctx);
        }
        cpu->can_do_io = 1;
        pTVar20 = (TranslationBlock *)(uVar15 & 0xfffffffffffffffc);
        if ((uVar15 & 2) != 0) {
          if (*(long *)(*(long *)((long)pvVar3 + 0x138a0) + 0x358) == 0) {
            uVar14 = *(uint *)(*(long *)((long)pvVar3 + 0x138a0) + 0x578);
            if (((0x12 < uVar14) || ((0x771c0U >> (uVar14 & 0x1f) & 1) == 0)) &&
               (cpu->uc->quit_request == false)) {
              p_Var8 = cpu->cc->synchronize_from_tb;
              if (p_Var8 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
                p_Var9 = cpu->cc->set_pc;
                if (p_Var9 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) goto LAB_00b58432;
                (*p_Var9)((CPUState_conflict *)cpu,pTVar20->pc);
              }
              else {
                (*p_Var8)((CPUState_conflict *)cpu,(TranslationBlock_conflict *)pTVar20);
              }
            }
          }
          cpu->tcg_exit_req = 0;
        }
        cpu->uc->last_tb = local_68;
        uVar14 = (uint)uVar15 & 3;
        pTVar19 = (TranslationBlock *)(ulong)uVar14;
        pTVar18 = pTVar20;
        if (uVar14 == 3) {
          pTVar18 = (TranslationBlock *)0x0;
          pTVar19 = (TranslationBlock *)0x3;
          if (-1 < *(int *)(cpu[1].tb_jmp_cache + 0x357)) {
            lVar6 = cpu->icount_budget;
            lVar16 = 0xffff;
            if (lVar6 < 0xffff) {
              lVar16 = lVar6;
            }
            uVar14 = (uint)lVar16;
            *(short *)(cpu[1].tb_jmp_cache + 0x357) = (short)lVar16;
            cpu->icount_extra = lVar6 - (int)uVar14;
            pTVar18 = (TranslationBlock *)0x0;
            pTVar19 = (TranslationBlock *)0x3;
            if (0 < (int)uVar14 && lVar6 - (int)uVar14 == 0) {
              uVar21 = 0x7fff;
              if ((int)uVar14 < 0x7fff) {
                uVar21 = uVar14;
              }
              pTVar18 = tb_gen_code_ppc64(cpu,pTVar20->pc,pTVar20->cs_base,pTVar20->flags,
                                          uVar21 | 0x10000);
              pTVar18->orig_tb = pTVar20;
              pvVar3 = cpu->env_ptr;
              pvVar7 = (pTVar18->tc).ptr;
              tb_exec_lock_ppc64((TCGContext_conflict10 *)cpu->uc->tcg_ctx);
              uVar15 = (**(code **)(*(long *)(*(long *)((long)pvVar3 + 0x138a0) + 0x2e8) + 0x90))
                                 (pvVar3,pvVar7);
              if (cpu->uc->nested_level == 1) {
                tb_exec_unlock_ppc64((TCGContext_conflict10 *)cpu->uc->tcg_ctx);
              }
              cpu->can_do_io = 1;
              if ((uVar15 & 2) != 0) {
                if (*(long *)(*(long *)((long)pvVar3 + 0x138a0) + 0x358) == 0) {
                  uVar14 = *(uint *)(*(long *)((long)pvVar3 + 0x138a0) + 0x578);
                  if (((0x12 < uVar14) || ((0x771c0U >> (uVar14 & 0x1f) & 1) == 0)) &&
                     (cpu->uc->quit_request == false)) {
                    pTVar25 = (TranslationBlock_conflict *)(uVar15 & 0xfffffffffffffffc);
                    p_Var8 = cpu->cc->synchronize_from_tb;
                    if (p_Var8 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
                      p_Var9 = cpu->cc->set_pc;
                      if (p_Var9 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) {
LAB_00b58432:
                        __assert_fail("cc->set_pc",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                                      ,0x61,
                                      "tcg_target_ulong cpu_tb_exec(CPUState *, TranslationBlock *)"
                                     );
                      }
                      vVar10._0_4_ = pTVar25->pc;
                      vVar10._4_4_ = pTVar25->cs_base;
                      (*p_Var9)((CPUState_conflict *)cpu,vVar10);
                    }
                    else {
                      (*p_Var8)((CPUState_conflict *)cpu,pTVar25);
                    }
                  }
                }
                cpu->tcg_exit_req = 0;
              }
              tb_phys_invalidate_ppc64
                        ((TCGContext_conflict10 *)cpu->uc->tcg_ctx,pTVar18,0xffffffffffffffff);
              tcg_tb_remove_ppc64((TCGContext_conflict10 *)cpu->uc->tcg_ctx,pTVar18);
              pTVar18 = (TranslationBlock *)0x0;
              pTVar19 = (TranslationBlock *)0x3;
            }
          }
        }
      }
      goto LAB_00b57dfc;
    }
    puVar24 = (uc_struct_conflict11 *)(ulong)uVar17;
  } while( true );
}

Assistant:

int cpu_exec(struct uc_struct *uc, CPUState *cpu)
{
    CPUClass *cc = CPU_GET_CLASS(cpu);
    int ret;
    // SyncClocks sc = { 0 };

    if (cpu_handle_halt(cpu)) {
        return EXCP_HALTED;
    }

    // rcu_read_lock();

    cc->cpu_exec_enter(cpu);

    /* Calculate difference between guest clock and host clock.
     * This delay includes the delay of the last cycle, so
     * what we have to do is sleep until it is 0. As for the
     * advance/delay we gain here, we try to fix it next time.
     */
    // init_delay_params(&sc, cpu);

    // Unicorn: We would like to support nested uc_emu_start calls.
    /* prepare setjmp context for exception handling */
    // if (sigsetjmp(cpu->jmp_env, 0) != 0) {
    if (sigsetjmp(uc->jmp_bufs[uc->nested_level - 1], 0) != 0) {
#if defined(__clang__) || !QEMU_GNUC_PREREQ(4, 6)
        /* Some compilers wrongly smash all local variables after
         * siglongjmp. There were bug reports for gcc 4.5.0 and clang.
         * Reload essential local variables here for those compilers.
         * Newer versions of gcc would complain about this code (-Wclobbered). */
        cc = CPU_GET_CLASS(cpu);
#else /* buggy compiler */
        /* Assert that the compiler does not smash local variables. */
        // g_assert(cpu == current_cpu);
        g_assert(cc == CPU_GET_CLASS(cpu));
#endif /* buggy compiler */

        assert_no_pages_locked();
    }

    /* if an exception is pending, we execute it here */
    while (!cpu_handle_exception(cpu, &ret)) {
        TranslationBlock *last_tb = NULL;
        int tb_exit = 0;

        while (!cpu_handle_interrupt(cpu, &last_tb)) {
            uint32_t cflags = cpu->cflags_next_tb;
            TranslationBlock *tb;

            /* When requested, use an exact setting for cflags for the next
               execution.  This is used for icount, precise smc, and stop-
               after-access watchpoints.  Since this request should never
               have CF_INVALID set, -1 is a convenient invalid value that
               does not require tcg headers for cpu_common_reset.  */
            if (cflags == -1) {
                cflags = curr_cflags();
            } else {
                cpu->cflags_next_tb = -1;
            }

            tb = tb_find(cpu, last_tb, tb_exit, cflags);
            if (unlikely(cpu->exit_request)) {
                continue;
            }
            cpu_loop_exec_tb(cpu, tb, &last_tb, &tb_exit);
            /* Try to align the host and virtual clocks
               if the guest is in advance */
            // align_clocks(&sc, cpu);
        }
    }

    // Unicorn: Clear any TCG exit flag that might have been left set by exit requests
    uc->cpu->tcg_exit_req = 0;

    cc->cpu_exec_exit(cpu);
    // rcu_read_unlock();

    return ret;
}